

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O0

Entry * array_new<Lib::DHMap<Indexing::IndexType,Indexing::IndexManager::Entry,Lib::DefaultHash,Lib::DefaultHash2>::Entry>
                  (void *placement,size_t length)

{
  long in_RSI;
  Entry *in_RDI;
  Entry *p;
  Entry *res;
  Entry *local_20;
  long local_10;
  
  local_20 = in_RDI;
  local_10 = in_RSI;
  while (local_10 != 0) {
    Lib::
    DHMap<Indexing::IndexType,_Indexing::IndexManager::Entry,_Lib::DefaultHash,_Lib::DefaultHash2>::
    Entry::Entry(local_20);
    local_20 = local_20 + 1;
    local_10 = local_10 + -1;
  }
  return in_RDI;
}

Assistant:

T* array_new(void* placement, size_t length)
{
  ASS_NEQ(placement,0);
  ASS_G(length,0);

  T* res=static_cast<T*>(placement);
  T* p=res;
  while(length--) {
    ::new(static_cast<void*>(p++)) T();
  }
  return res;
}